

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::E_formatter<spdlog::details::scoped_padder>::format
          (E_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  duration<long,_std::ratio<1L,_1L>_> local_70;
  rep local_68;
  rep seconds;
  duration duration;
  scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  E_formatter<spdlog::details::scoped_padder> *this_local;
  
  scoped_padder::scoped_padder
            ((scoped_padder *)&duration,10,&(this->super_flag_formatter).padinfo_,dest);
  seconds = (rep)CLI::std::chrono::
                 time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 ::time_since_epoch(&msg->time);
  local_70.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)&seconds);
  local_68 = CLI::std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_70);
  fmt_helper::append_int<long>(local_68,dest);
  scoped_padder::~scoped_padder((scoped_padder *)&duration);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }